

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O3

void printAddrMode3Operand(MCInst *MI,uint Op,SStream *O,_Bool AlwaysPrintImm0)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  ulong uVar4;
  _Bool _Var5;
  uint uVar6;
  MCOperand *pMVar7;
  MCOperand *op;
  MCOperand *op_00;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  char *fmt;
  int iVar11;
  
  pMVar7 = MCInst_getOperand(MI,Op);
  _Var5 = MCOperand_isReg(pMVar7);
  if (!_Var5) {
    printOperand(MI,Op,O);
    return;
  }
  pMVar7 = MCInst_getOperand(MI,Op);
  op = MCInst_getOperand(MI,Op + 1);
  op_00 = MCInst_getOperand(MI,Op + 2);
  uVar8 = MCOperand_getImm(op_00);
  SStream_concat0(O,"[");
  set_mem_access(MI,true);
  pcVar2 = MI->csh;
  uVar6 = MCOperand_getReg(pMVar7);
  pcVar9 = (*pcVar2->get_regname)(uVar6);
  SStream_concat0(O,pcVar9);
  if (MI->csh->detail != CS_OPT_OFF) {
    uVar6 = MCOperand_getReg(pMVar7);
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar6;
  }
  uVar4 = uVar8 >> 8;
  uVar6 = MCOperand_getReg(op);
  if (uVar6 == 0) {
    uVar10 = MCOperand_getImm(op_00);
    iVar11 = (int)(uVar10 & 0xff);
    if ((((byte)(uVar8 >> 8) | AlwaysPrintImm0) & 1) != 0 || (byte)uVar10 != 0) {
      pcVar9 = anon_var_dwarf_e9f48 + 0x11;
      if ((uVar4 & 1) != 0) {
        pcVar9 = "-";
      }
      fmt = ", #%s%u";
      if (9 < (byte)uVar10) {
        fmt = ", #%s0x%x";
      }
      SStream_concat(O,fmt,pcVar9,uVar10 & 0xff);
    }
    if (MI->csh->detail == CS_OPT_OFF) goto LAB_00160db7;
    if ((uVar4 & 1) == 0) {
      pcVar3 = MI->flat_insn->detail;
      *(int *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x52) = iVar11;
      goto LAB_00160db7;
    }
    pcVar3 = MI->flat_insn->detail;
    *(int *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x52) = -iVar11;
  }
  else {
    SStream_concat0(O,", ");
    pcVar9 = "-";
    if ((uVar4 & 1) == 0) {
      pcVar9 = anon_var_dwarf_e9f48 + 0x11;
    }
    SStream_concat0(O,pcVar9);
    pcVar2 = MI->csh;
    uVar6 = MCOperand_getReg(op);
    pcVar9 = (*pcVar2->get_regname)(uVar6);
    SStream_concat0(O,pcVar9);
    if (MI->csh->detail == CS_OPT_OFF) goto LAB_00160db7;
    uVar6 = MCOperand_getReg(op);
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x4a) = uVar6;
    if ((uVar4 & 1) == 0) goto LAB_00160db7;
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x4e;
    puVar1[0] = 0xff;
    puVar1[1] = 0xff;
    puVar1[2] = 0xff;
    puVar1[3] = 0xff;
  }
  pcVar3 = MI->flat_insn->detail;
  pcVar3->groups[(ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x56] = '\x01';
LAB_00160db7:
  SStream_concat0(O,"]");
  if (MI->csh->detail == CS_OPT_ON) {
    MI->csh->doing_mem = false;
    puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printAddrMode3Operand(MCInst *MI, unsigned Op, SStream *O,
		bool AlwaysPrintImm0)
{
	MCOperand *MO1 = MCInst_getOperand(MI, Op);
	if (!MCOperand_isReg(MO1)) {   //  For label symbolic references.
		printOperand(MI, Op, O);
		return;
	}

	printAM3PreOrOffsetIndexOp(MI, Op, O, AlwaysPrintImm0);
}